

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int libyuv::ARGBSobelize
              (uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,int width
              ,int height,_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SobelRow)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  uint8_t *row_yt;
  uint8_t *row_y2;
  uint8_t *row_y1;
  uint8_t *row_y0;
  uint8_t *row_y;
  uint8_t *row_sobely;
  uint8_t *row_sobelx;
  uint8_t *rows;
  uint8_t *rows_mem;
  int kRowSize;
  int kEdge;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SobelXRow;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SobelYRow;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *ARGBToYJRow;
  int y;
  undefined8 in_stack_ffffffffffffff70;
  int test_flag;
  undefined1 *puVar6;
  undefined1 *local_88;
  undefined1 *local_80;
  code *local_48;
  code *local_40;
  code *local_38;
  int local_30;
  int local_2c;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_38 = ARGBToYJRow_C;
  local_40 = SobelYRow_C;
  local_48 = SobelXRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_2c = in_R9D;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      local_2c = -in_R9D;
      local_10 = in_RDI + (local_2c + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    test_flag = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    iVar2 = TestCpuFlag(test_flag);
    if ((iVar2 != 0) && (local_38 = ARGBToYJRow_Any_SSSE3, (in_R8D & 0xf) == 0)) {
      local_38 = ARGBToYJRow_SSSE3;
    }
    iVar2 = TestCpuFlag(test_flag);
    if ((iVar2 != 0) && (local_38 = ARGBToYJRow_Any_AVX2, (in_R8D & 0x1f) == 0)) {
      local_38 = ARGBToYJRow_AVX2;
    }
    iVar2 = TestCpuFlag(test_flag);
    if (iVar2 != 0) {
      local_40 = SobelYRow_SSE2;
    }
    iVar2 = TestCpuFlag(test_flag);
    if (iVar2 != 0) {
      local_48 = SobelXRow_SSE2;
    }
    uVar3 = in_R8D + 0x2f & 0xffffffe0;
    __ptr = malloc((long)(int)(uVar3 * 5 + 0x5f));
    uVar4 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
    lVar5 = uVar4 + (long)(int)(uVar3 << 1);
    local_80 = (undefined1 *)(lVar5 + 0x10);
    local_88 = local_80 + (int)uVar3;
    (*local_38)(local_10,local_80,in_R8D);
    *(undefined1 *)(lVar5 + 0xf) = *local_80;
    memset(local_80 + (int)in_R8D,(uint)(byte)local_80[(int)(in_R8D - 1)],0x10);
    (*local_38)(local_10,local_88,in_R8D);
    local_88[-1] = *local_88;
    memset(local_88 + (int)in_R8D,(uint)(byte)local_88[(int)(in_R8D - 1)],0x10);
    memset(local_88 + (int)uVar3 + (int)in_R8D,0,0x10);
    puVar1 = local_88 + (int)uVar3;
    local_20 = in_RDX;
    for (local_30 = 0; puVar6 = puVar1, puVar1 = local_80, local_30 < local_2c;
        local_30 = local_30 + 1) {
      if (local_30 < local_2c + -1) {
        local_10 = local_10 + local_14;
      }
      (*local_38)(local_10,puVar6,in_R8D);
      puVar6[-1] = *puVar6;
      puVar6[(int)in_R8D] = puVar6[(int)(in_R8D - 1)];
      (*local_48)(local_80 + -1,local_88 + -1,puVar6 + -1,uVar4,in_R8D);
      (*local_40)(local_80 + -1,puVar6 + -1,uVar4 + (long)(int)uVar3,in_R8D);
      (*(code *)row_y2)(uVar4,uVar4 + (long)(int)uVar3,local_20,in_R8D);
      local_80 = local_88;
      local_20 = local_20 + in_ECX;
      local_88 = puVar6;
    }
    free(__ptr);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ARGBSobelize(const uint8_t* src_argb,
                        int src_stride_argb,
                        uint8_t* dst_argb,
                        int dst_stride_argb,
                        int width,
                        int height,
                        void (*SobelRow)(const uint8_t* src_sobelx,
                                         const uint8_t* src_sobely,
                                         uint8_t* dst,
                                         int width)) {
  int y;
  void (*ARGBToYJRow)(const uint8_t* src_argb, uint8_t* dst_g, int width) =
      ARGBToYJRow_C;
  void (*SobelYRow)(const uint8_t* src_y0, const uint8_t* src_y1,
                    uint8_t* dst_sobely, int width) = SobelYRow_C;
  void (*SobelXRow)(const uint8_t* src_y0, const uint8_t* src_y1,
                    const uint8_t* src_y2, uint8_t* dst_sobely, int width) =
      SobelXRow_C;
  const int kEdge = 16;  // Extra pixels at start of row for extrude/align.
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }

#if defined(HAS_ARGBTOYJROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBToYJRow = ARGBToYJRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      ARGBToYJRow = ARGBToYJRow_SSSE3;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBToYJRow = ARGBToYJRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      ARGBToYJRow = ARGBToYJRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBToYJRow = ARGBToYJRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBToYJRow = ARGBToYJRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBToYJRow = ARGBToYJRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      ARGBToYJRow = ARGBToYJRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBToYJRow = ARGBToYJRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      ARGBToYJRow = ARGBToYJRow_MSA;
    }
  }
#endif

#if defined(HAS_SOBELYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelYRow = SobelYRow_SSE2;
  }
#endif
#if defined(HAS_SOBELYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelYRow = SobelYRow_NEON;
  }
#endif
#if defined(HAS_SOBELYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelYRow = SobelYRow_MMI;
  }
#endif
#if defined(HAS_SOBELYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelYRow = SobelYRow_MSA;
  }
#endif
#if defined(HAS_SOBELXROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelXRow = SobelXRow_SSE2;
  }
#endif
#if defined(HAS_SOBELXROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelXRow = SobelXRow_NEON;
  }
#endif
#if defined(HAS_SOBELXROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelXRow = SobelXRow_MMI;
  }
#endif
#if defined(HAS_SOBELXROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelXRow = SobelXRow_MSA;
  }
#endif
  {
    // 3 rows with edges before/after.
    const int kRowSize = (width + kEdge + 31) & ~31;
    align_buffer_64(rows, kRowSize * 2 + (kEdge + kRowSize * 3 + kEdge));
    uint8_t* row_sobelx = rows;
    uint8_t* row_sobely = rows + kRowSize;
    uint8_t* row_y = rows + kRowSize * 2;

    // Convert first row.
    uint8_t* row_y0 = row_y + kEdge;
    uint8_t* row_y1 = row_y0 + kRowSize;
    uint8_t* row_y2 = row_y1 + kRowSize;
    ARGBToYJRow(src_argb, row_y0, width);
    row_y0[-1] = row_y0[0];
    memset(row_y0 + width, row_y0[width - 1], 16);  // Extrude 16 for valgrind.
    ARGBToYJRow(src_argb, row_y1, width);
    row_y1[-1] = row_y1[0];
    memset(row_y1 + width, row_y1[width - 1], 16);
    memset(row_y2 + width, 0, 16);

    for (y = 0; y < height; ++y) {
      // Convert next row of ARGB to G.
      if (y < (height - 1)) {
        src_argb += src_stride_argb;
      }
      ARGBToYJRow(src_argb, row_y2, width);
      row_y2[-1] = row_y2[0];
      row_y2[width] = row_y2[width - 1];

      SobelXRow(row_y0 - 1, row_y1 - 1, row_y2 - 1, row_sobelx, width);
      SobelYRow(row_y0 - 1, row_y2 - 1, row_sobely, width);
      SobelRow(row_sobelx, row_sobely, dst_argb, width);

      // Cycle thru circular queue of 3 row_y buffers.
      {
        uint8_t* row_yt = row_y0;
        row_y0 = row_y1;
        row_y1 = row_y2;
        row_y2 = row_yt;
      }

      dst_argb += dst_stride_argb;
    }
    free_aligned_buffer_64(rows);
  }
  return 0;
}